

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawElementsBaseVertexTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_0::VertexIDCase::draw
          (VertexIDCase *this,GLenum mode,GLsizei count,GLenum type,GLvoid *indices,GLint baseVertex
          )

{
  DrawMethod DVar1;
  GLenum GVar2;
  int line;
  undefined4 in_register_00000034;
  void *pvVar3;
  char *msg;
  GLint maxElementsVertices;
  
  pvVar3 = (void *)CONCAT44(in_register_00000034,mode);
  DVar1 = this->m_method;
  if (DVar1 == DRAWMETHOD_DRAWELEMENTS_RANGED_BASEVERTEX) {
    maxElementsVertices = 0;
    (*this->m_gl->getIntegerv)(33000,&maxElementsVertices);
    GVar2 = (*this->m_gl->getError)();
    glu::checkError(GVar2,"getIntegerv(GL_MAX_ELEMENTS_VERTICES, &maxElementsVertices)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawElementsBaseVertexTests.cpp"
                    ,0x121);
    (*this->m_gl->drawRangeElementsBaseVertex)(4,0,maxElementsVertices,6,0x1403,pvVar3,4);
    GVar2 = (*this->m_gl->getError)();
    glu::checkError(GVar2,
                    "drawRangeElementsBaseVertex(mode, 0, maxElementsVertices, count, type, indices, baseVertex)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawElementsBaseVertexTests.cpp"
                    ,0x122);
    return;
  }
  if (DVar1 == DRAWMETHOD_DRAWELEMENTS_INSTANCED_BASEVERTEX) {
    (*this->m_gl->drawElementsInstancedBaseVertex)(4,6,0x1403,pvVar3,1,4);
    GVar2 = (*this->m_gl->getError)();
    msg = "drawElementsInstancedBaseVertex(mode, count, type, indices, 1, baseVertex)";
    line = 0x127;
  }
  else {
    if (DVar1 != DRAWMETHOD_DRAWELEMENTS_BASEVERTEX) {
      return;
    }
    (*this->m_gl->drawElementsBaseVertex)(4,6,0x1403,pvVar3,4);
    GVar2 = (*this->m_gl->getError)();
    msg = "drawElementsBaseVertex(mode, count, type, indices, baseVertex)";
    line = 0x11b;
  }
  glu::checkError(GVar2,msg,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawElementsBaseVertexTests.cpp"
                  ,line);
  return;
}

Assistant:

void VertexIDCase::draw (GLenum mode, GLsizei count, GLenum type, GLvoid* indices, GLint baseVertex)
{
	switch (m_method)
	{
		case gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_BASEVERTEX:
			GLU_CHECK_GLW_CALL(m_gl, drawElementsBaseVertex(mode, count, type, indices, baseVertex));
			break;

		case gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_RANGED_BASEVERTEX:
		{
			GLint maxElementsVertices = 0;
			GLU_CHECK_GLW_CALL(m_gl, getIntegerv(GL_MAX_ELEMENTS_VERTICES, &maxElementsVertices));
			GLU_CHECK_GLW_CALL(m_gl, drawRangeElementsBaseVertex(mode, 0, maxElementsVertices, count, type, indices, baseVertex));
			break;
		}

		case gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_INSTANCED_BASEVERTEX:
				GLU_CHECK_GLW_CALL(m_gl, drawElementsInstancedBaseVertex(mode, count, type, indices, 1, baseVertex));
				break;

		default:
			DE_FATAL("Draw method not supported");
	}
}